

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_match.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseMatch(Parser *this)

{
  Token *pTVar1;
  size_t sVar2;
  pointer pcVar3;
  Lexer *lexer;
  size_t sVar4;
  istream *piVar5;
  bool bVar6;
  Lexer *this_00;
  Parser *in_RSI;
  pointer __p;
  bool err;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> anyCase;
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  cases;
  bool local_91;
  undefined1 local_90 [24];
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  local_78;
  Position local_58;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  
  pTVar1 = in_RSI->lexer->currentToken;
  local_58.line = (pTVar1->pos).line;
  local_58.startIndex = (pTVar1->pos).startIndex;
  local_58.endIndex = (pTVar1->pos).endIndex;
  sanityExpect(in_RSI,TOK_KW_MATCH);
  local_91 = false;
  parseExpression((Parser *)(local_90 + 0x10),(Precedence)in_RSI);
  bVar6 = expect(in_RSI,TOK_EOL);
  if (!bVar6) {
    pTVar1 = in_RSI->lexer->currentToken;
    local_78.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
    sVar2 = (pTVar1->pos).endIndex;
    ((Error<pfederc::SyntaxErrorCode> *)
    local_78.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
    ((Error<pfederc::SyntaxErrorCode> *)
    local_78.
    super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_EOL;
    sVar4 = (pTVar1->pos).startIndex;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_78.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).line = (pTVar1->pos).line;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_78.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).startIndex = sVar4;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_78.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->pos).endIndex = sVar2;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_78.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_78.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((Error<pfederc::SyntaxErrorCode> *)
     local_78.
     super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)(local_30 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_30 + 8));
    if ((Error<pfederc::SyntaxErrorCode> *)
        local_78.
        super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_78,
                 (Error<pfederc::SyntaxErrorCode> *)
                 local_78.
                 super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_78.
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parseMatchCases(in_RSI,&local_91,&local_78);
  local_90._8_8_ = (Lexer *)0x0;
  bVar6 = expect(in_RSI,TOK_ANY);
  if (bVar6) {
    bVar6 = expect(in_RSI,TOK_IMPL);
    if (!bVar6) {
      pTVar1 = in_RSI->lexer->currentToken;
      local_90._0_8_ = operator_new(0x38);
      pcVar3 = (pointer)(pTVar1->pos).endIndex;
      *(undefined2 *)local_90._0_8_ = 2;
      *(SyntaxErrorCode *)(local_90._0_8_ + 4) = STX_ERR_EXPECTED_OP_IMPL;
      piVar5 = (istream *)(pTVar1->pos).startIndex;
      ((Position *)(local_90._0_8_ + 8))->line = (pTVar1->pos).line;
      *(istream **)(local_90._0_8_ + 0x10) = piVar5;
      (((string *)(local_90._0_8_ + 0x18))->_M_dataplus)._M_p = pcVar3;
      (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(local_90._0_8_ + 0x20))->
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_90._0_8_ + 0x28))->_M_allocated_capacity = 0;
      *(pointer *)(local_90._0_8_ + 0x30) = (pointer)0x0;
      generateError((Parser *)local_30,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_30);
      if ((Lexer *)local_90._0_8_ != (Lexer *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_90,
                   (Error<pfederc::SyntaxErrorCode> *)local_90._0_8_);
      }
    }
    parseFunctionBody((Parser *)local_90);
    local_90._8_8_ = local_90._0_8_;
    local_90._0_8_ =
         (__uniq_ptr_impl<pfederc::MatchExpr,_std::default_delete<pfederc::MatchExpr>_>)0x0;
    std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_90);
    bVar6 = expect(in_RSI,TOK_STMT);
    if (!bVar6) {
      pTVar1 = in_RSI->lexer->currentToken;
      local_90._0_8_ = operator_new(0x38);
      pcVar3 = (pointer)(pTVar1->pos).endIndex;
      *(undefined2 *)local_90._0_8_ = 2;
      *(SyntaxErrorCode *)(local_90._0_8_ + 4) = STX_ERR_EXPECTED_STMT;
      piVar5 = (istream *)(pTVar1->pos).startIndex;
      ((Position *)(local_90._0_8_ + 8))->line = (pTVar1->pos).line;
      *(istream **)(local_90._0_8_ + 0x10) = piVar5;
      (((string *)(local_90._0_8_ + 0x18))->_M_dataplus)._M_p = pcVar3;
      (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(local_90._0_8_ + 0x20))->
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_90._0_8_ + 0x28))->_M_allocated_capacity = 0;
      *(pointer *)(local_90._0_8_ + 0x30) = (pointer)0x0;
      generateError((Parser *)(local_40 + 8),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_40 + 8));
      if ((_Head_base<0UL,_pfederc::MatchExpr_*,_false>)local_90._0_8_ !=
          (_Head_base<0UL,_pfederc::MatchExpr_*,_false>)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_90,
                   (Error<pfederc::SyntaxErrorCode> *)local_90._0_8_);
      }
    }
    skipEol(in_RSI);
  }
  bVar6 = expect(in_RSI,TOK_STMT);
  if (!bVar6) {
    pTVar1 = in_RSI->lexer->currentToken;
    local_90._0_8_ = operator_new(0x38);
    pcVar3 = (pointer)(pTVar1->pos).endIndex;
    *(undefined2 *)local_90._0_8_ = 2;
    *(SyntaxErrorCode *)(local_90._0_8_ + 4) = STX_ERR_EXPECTED_STMT;
    piVar5 = (istream *)(pTVar1->pos).startIndex;
    ((Position *)(local_90._0_8_ + 8))->line = (pTVar1->pos).line;
    *(istream **)(local_90._0_8_ + 0x10) = piVar5;
    (((string *)(local_90._0_8_ + 0x18))->_M_dataplus)._M_p = pcVar3;
    (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(local_90._0_8_ + 0x20))->
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_90._0_8_ + 0x28))->_M_allocated_capacity = 0;
    *(pointer *)(local_90._0_8_ + 0x30) = (pointer)0x0;
    generateError((Parser *)local_40,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_40)
    ;
    if ((_Head_base<0UL,_pfederc::MatchExpr_*,_false>)local_90._0_8_ !=
        (_Head_base<0UL,_pfederc::MatchExpr_*,_false>)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_90,
                 (Error<pfederc::SyntaxErrorCode> *)local_90._0_8_);
    }
  }
  if (((pointer)local_90._16_8_ == (pointer)0x0) ||
     (local_78.
      super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_78.
      super__Vector_base<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    this->lexer = (Lexer *)0x0;
  }
  else {
    lexer = in_RSI->lexer;
    this_00 = (Lexer *)operator_new(0x60);
    MatchExpr::MatchExpr
              ((MatchExpr *)this_00,lexer,&local_58,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_90 + 0x10),
               &local_78,
               (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
               (local_90 + 8));
    local_90._0_8_ =
         (__uniq_ptr_impl<pfederc::MatchExpr,_std::default_delete<pfederc::MatchExpr>_>)0x0;
    this->lexer = this_00;
    std::unique_ptr<pfederc::MatchExpr,_std::default_delete<pfederc::MatchExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::MatchExpr,_std::default_delete<pfederc::MatchExpr>_> *)local_90)
    ;
  }
  std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)
             (local_90 + 8));
  std::
  vector<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<const_pfederc::Token_*,_std::allocator<const_pfederc::Token_*>_>,_std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>_>_>_>
  ::~vector(&local_78);
  if ((pointer)local_90._16_8_ != (pointer)0x0) {
    (*(code *)(((((__uniq_ptr_data<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>,_true,_true>
                   *)local_90._16_8_)->
                super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                )._M_t.
                super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>.
               _M_head_impl)->pos).line)();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseMatch() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_MATCH);

  bool err = false;

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
  }

  std::vector<MatchPattern> cases;
  parseMatchCases(err, cases);

  std::unique_ptr<BodyExpr> anyCase;
  if (expect(TokenType::TOK_ANY)) {
    if (!expect(TokenType::TOK_IMPL)) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_EXPECTED_OP_IMPL,
              lexer.getCurrentToken()->getPosition()));
    }

    anyCase = parseFunctionBody();
    if (!expect(TokenType::TOK_STMT)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_EXPECTED_STMT,
            lexer.getCurrentToken()->getPosition()));
    }

    skipEol();
  }

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_STMT,
          lexer.getCurrentToken()->getPosition()));
  }

  if (!expr || cases.empty() || err)
    return nullptr;

  return std::make_unique<MatchExpr>(lexer, pos, std::move(expr),
      std::move(cases), std::move(anyCase));
}